

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_EstimateCofactor(DdManager *dd,DdNode *f,int i,int phase)

{
  st__table *table_00;
  st__table *table;
  DdNode *ptr;
  int local_28;
  int val;
  int phase_local;
  int i_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_28 = phase;
  val = i;
  _phase_local = f;
  f_local = &dd->sentinel;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    dd_local._4_4_ = -1;
  }
  else {
    ptr._4_4_ = cuddEstimateCofactor
                          ((DdManager *)f_local,table_00,
                           (DdNode *)((ulong)_phase_local & 0xfffffffffffffffe),val,local_28,
                           (DdNode **)&table);
    ddClearFlag((DdNode *)((ulong)_phase_local & 0xfffffffffffffffe));
    st__free_table(table_00);
    dd_local._4_4_ = ptr._4_4_;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_EstimateCofactor(
  DdManager *dd /* manager */,
  DdNode * f    /* function */,
  int i         /* index of variable */,
  int phase     /* 1: positive; 0: negative */
  )
{
    int val;
    DdNode *ptr;
    st__table *table;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(CUDD_OUT_OF_MEM);
    val = cuddEstimateCofactor(dd,table,Cudd_Regular(f),i,phase,&ptr);
    ddClearFlag(Cudd_Regular(f));
    st__free_table(table);

    return(val);

}